

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_itrans_recon_dc.c
# Opt level: O2

void ihevcd_itrans_recon_dc_chroma
               (UWORD8 *pu1_pred,UWORD8 *pu1_dst,WORD32 pred_strd,WORD32 dst_strd,
               WORD32 log2_trans_size,WORD16 i2_coeff_value)

{
  int iVar1;
  int iVar2;
  UWORD8 UVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  undefined6 in_register_0000008a;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  
  uVar8 = 1 << ((byte)log2_trans_size & 0x1f);
  uVar7 = 0;
  if (0 < (int)uVar8) {
    uVar7 = uVar8;
  }
  iVar5 = 0;
  iVar6 = 0;
  for (uVar9 = 0; uVar10 = (ulong)uVar8, iVar1 = iVar5, iVar2 = iVar6, uVar9 != uVar7;
      uVar9 = uVar9 + 1) {
    while (uVar10 != 0) {
      iVar4 = (uint)pu1_pred[iVar2] +
              (((int)CONCAT62(in_register_0000008a,i2_coeff_value) * 0x40 + 0x40 >> 1) + 0x800 >>
              0xc);
      if (iVar4 < 1) {
        iVar4 = 0;
      }
      UVar3 = (UWORD8)iVar4;
      if (0xfe < iVar4) {
        UVar3 = 0xff;
      }
      pu1_dst[iVar1] = UVar3;
      uVar10 = uVar10 - 1;
      iVar1 = iVar1 + 2;
      iVar2 = iVar2 + 2;
    }
    iVar6 = iVar6 + pred_strd;
    iVar5 = iVar5 + dst_strd;
  }
  return;
}

Assistant:

void ihevcd_itrans_recon_dc_chroma(UWORD8 *pu1_pred,
                                   UWORD8 *pu1_dst,
                                   WORD32 pred_strd,
                                   WORD32 dst_strd,
                                   WORD32 log2_trans_size,
                                   WORD16 i2_coeff_value)
{
    WORD32 row, col;
    WORD32 add, shift;
    WORD32 dc_value, quant_out;
    WORD32 trans_size;


    trans_size = (1 << log2_trans_size);

    quant_out = i2_coeff_value;

    shift = IT_SHIFT_STAGE_1;
    add = 1 << (shift - 1);
    dc_value = CLIP_S16((quant_out * 64 + add) >> shift);
    shift = IT_SHIFT_STAGE_2;
    add = 1 << (shift - 1);
    dc_value = CLIP_S16((dc_value * 64 + add) >> shift);

    for(row = 0; row < trans_size; row++)
        for(col = 0; col < trans_size; col++)
            pu1_dst[row * dst_strd + (col << 1)] = CLIP_U8((pu1_pred[row * pred_strd + (col << 1)] + dc_value));

}